

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void indigox::Options::AssignElectrons::Reset(void)

{
  long lVar1;
  allocator local_149;
  allocator local_148;
  allocator local_147;
  allocator local_146;
  allocator local_145;
  allocator local_144;
  allocator local_143;
  allocator local_142;
  allocator local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  ALGORITHM = FPT;
  std::__cxx11::string::assign((char *)&ATOM_ENERGY_FILE_abi_cxx11_);
  std::__cxx11::string::assign((char *)&BOND_ENERGY_FILE_abi_cxx11_);
  INF = 0xffffffff;
  MAXIMUM_BOND_ORDER = 3;
  USE_ELECTRON_PAIRS = true;
  AUTO_USE_ELECTRON_PAIRS = true;
  USE_CHARGED_BOND_ENERGIES = false;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&ALLOWED_ELEMENTS_abi_cxx11_._M_t);
  std::__cxx11::string::string((string *)&local_140,"H",&local_141);
  std::__cxx11::string::string(local_120,"C",&local_142);
  std::__cxx11::string::string(local_100,"N",&local_143);
  std::__cxx11::string::string(local_e0,"O",&local_144);
  std::__cxx11::string::string(local_c0,"S",&local_145);
  std::__cxx11::string::string(local_a0,"P",&local_146);
  std::__cxx11::string::string(local_80,"F",&local_147);
  std::__cxx11::string::string(local_60,"Cl",&local_148);
  std::__cxx11::string::string(local_40,"Br",&local_149);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_assign_unique<std::__cxx11::string_const*>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&ALLOWED_ELEMENTS_abi_cxx11_,&local_140,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffe0);
  lVar1 = 0x100;
  do {
    std::__cxx11::string::~string((string *)((long)&local_140._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  HIGHEST_MAGNITUDE_CHARGE = 0;
  MAXIMUM_RESULT_COUNT = 0;
  ALLOW_CHARGED_CARBON = true;
  PREPLACE_ELECTRONS = true;
  AStar::HEURISTIC = ABSTEMIOUS;
  AStar::MEGABYTE_LIMIT = 0x1000;
  FPT::Reset();
  LocalOptimisation::OPTIMISE_ALL_MINIMUMS = true;
  LocalOptimisation::CACHE_RESULTS = true;
  LocalOptimisation::CACHE_INFINITIES = false;
  LocalOptimisation::TIMEOUT_LIMIT = 1000;
  return;
}

Assistant:

void assign_::Reset() {
  // AssignElectron general
  assign_::ALGORITHM = DFT_ASSIGNELECTRON_ALGORITHM;
  assign_::ATOM_ENERGY_FILE = DFT_ASSIGNELECTRON_ATOM_FILE;
  assign_::BOND_ENERGY_FILE = DFT_ASSIGNELECTRON_BOND_FILE;
  assign_::INF = DFT_ASSIGNELECTRON_INFINITY;
  assign_::MAXIMUM_BOND_ORDER = DFT_ASSIGNELECTRON_MAX_BOND_ORDER;
  assign_::USE_ELECTRON_PAIRS = DFT_ASSIGNELECTRON_USE_PAIRS;
  assign_::AUTO_USE_ELECTRON_PAIRS = DFT_ASSIGNELECTRON_AUTO_USE_PAIRS;
  assign_::USE_CHARGED_BOND_ENERGIES = DFT_ASSIGNELECTRON_CHARGED_BONDS;
  assign_::ALLOWED_ELEMENTS.clear();
  assign_::ALLOWED_ELEMENTS = {DFT_ASSIGNELECTRON_ALLOWED_ELEMENTS};
  assign_::HIGHEST_MAGNITUDE_CHARGE = DFT_ASSIGNELECTRON_HIGHEST_CHARGE;
  assign_::ALLOW_CHARGED_CARBON = DFT_ASSIGNELECTRON_ALLOW_CHARGE_CARBON;
  assign_::MAXIMUM_RESULT_COUNT = DFT_ASSIGNELECTRON_MAX_RESULT;
  assign_::PREPLACE_ELECTRONS = DFT_ASSIGNELECTRON_PREPLACE;
  
  // Reset all sub options
  astar_::Reset();
  fpt_::Reset();
  lo_::Reset();
}